

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameManager.cpp
# Opt level: O1

void __thiscall myvk::FrameManager::recreate_swapchain(FrameManager *this)

{
  Ptr<Swapchain> *old_swapchain;
  undefined8 *puVar1;
  GLFWwindow *handle;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer psVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  shared_ptr<myvk::Fence> *i;
  pointer psVar9;
  int height;
  int width;
  int local_70;
  int local_6c;
  undefined1 local_68 [40];
  element_type *peStack_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  handle = ((((((this->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->m_present_queue_ptr).
              super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_surface_ptr).super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_window;
  local_6c = 0;
  local_70 = 0;
  glfwGetFramebufferSize(handle,&local_6c,&local_70);
  if ((local_6c == 0) || (local_70 == 0)) {
    do {
      do {
        glfwGetFramebufferSize(handle,&local_6c,&local_70);
        glfwWaitEvents();
      } while (local_6c == 0);
    } while (local_70 == 0);
  }
  old_swapchain = &this->m_swapchain;
  psVar2 = (this->m_frame_fences).
           super__Vector_base<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (this->m_frame_fences).
                super__Vector_base<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar2; psVar9 = psVar9 + 1) {
    Fence::Wait((psVar9->super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                0xffffffffffffffff);
  }
  Swapchain::Create((Swapchain *)local_68,old_swapchain);
  uVar6 = local_68._8_8_;
  uVar5 = local_68._0_8_;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (element_type *)0x0;
  p_Var3 = (this->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar5;
  (this->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  SwapchainImage::Create
            ((vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
              *)(local_68 + 0x20),old_swapchain);
  local_68._0_8_ =
       (this->m_swapchain_images).
       super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68._8_8_ =
       (this->m_swapchain_images).
       super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68._16_8_ =
       (this->m_swapchain_images).
       super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_swapchain_images).
  super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_68._32_8_;
  (this->m_swapchain_images).
  super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)peStack_40;
  (this->m_swapchain_images).
  super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_38._M_pi;
  local_68._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peStack_40 = (element_type *)0x0;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ::~vector((vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
             *)local_68);
  std::
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ::~vector((vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
             *)(local_68 + 0x20));
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::clear(&this->m_swapchain_image_views);
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::resize(&this->m_swapchain_image_views,
           (ulong)((this->m_swapchain).
                   super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  m_image_count);
  if (((this->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_image_count != 0) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      ImageView::Create((ImageView *)local_68,
                        (Ptr<SwapchainImage> *)
                        ((long)&(((this->m_swapchain_images).
                                  super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar7));
      uVar6 = local_68._8_8_;
      uVar5 = local_68._0_8_;
      psVar4 = (this->m_swapchain_image_views).
               super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_68._0_8_ = (pointer)0x0;
      local_68._8_8_ = (element_type *)0x0;
      p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)&(psVar4->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi + lVar7);
      puVar1 = (undefined8 *)
               ((long)&(psVar4->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + lVar7);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar8 < ((old_swapchain->
                      super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                     m_image_count);
  }
  return;
}

Assistant:

void FrameManager::recreate_swapchain() {
	GLFWwindow *window = m_swapchain->GetPresentQueuePtr()->GetSurfacePtr()->GetGlfwWindow();
	int width = 0, height = 0;
	glfwGetFramebufferSize(window, &width, &height);
	while (width == 0 || height == 0) {
		glfwGetFramebufferSize(window, &width, &height);
		glfwWaitEvents();
	}

	for (const auto &i : m_frame_fences)
		i->Wait();

	m_swapchain = Swapchain::Create(m_swapchain);
	m_swapchain_images = myvk::SwapchainImage::Create(m_swapchain);
	m_swapchain_image_views.clear();
	m_swapchain_image_views.resize(m_swapchain->GetImageCount());
	for (uint32_t i = 0; i < m_swapchain->GetImageCount(); ++i)
		m_swapchain_image_views[i] = myvk::ImageView::Create(m_swapchain_images[i]);
}